

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::shorten_number(string *unit_string,size_t loc,size_t length)

{
  bool bVar1;
  reference pvVar2;
  __const_iterator in_RDX;
  long in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  int kk;
  value_type c;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffdf;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar4;
  
  pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](in_stack_ffffffffffffffc0,
                      CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  uVar4 = CONCAT13(*pvVar2,(int3)in_stack_ffffffffffffffe4);
  if (*pvVar2 == '.') {
    pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_ffffffffffffffc0,
                        CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    uVar4 = CONCAT13(*pvVar2,(int3)uVar4);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (size_type)in_stack_ffffffffffffffc0);
  if ((char)((uint)uVar4 >> 0x18) == '9') {
    pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_ffffffffffffffc0,
                        CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    if (*pvVar2 == '9') {
      iVar3 = 1;
      while (pvVar2 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (in_stack_ffffffffffffffc0,
                                 CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)),
            *pvVar2 == '9') {
        pvVar2 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffffc0,
                            CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        *pvVar2 = '0';
        if (in_RSI == iVar3) break;
        iVar3 = iVar3 + 1;
      }
      if ((in_RSI == iVar3) &&
         (pvVar2 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_stack_ffffffffffffffc0,
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)),
         *pvVar2 == '0')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  (in_RDI,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar4,iVar3),in_RDX,in_stack_ffffffffffffffdf);
      }
      else {
        pvVar2 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffffc0,
                            CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
        bVar1 = isDigitCharacter(*pvVar2);
        if (bVar1) {
          pvVar2 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_stack_ffffffffffffffc0,
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
          *pvVar2 = *pvVar2 + '\x01';
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (size_type)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
        }
      }
    }
    else {
      pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_ffffffffffffffc0,
                            CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      *pvVar2 = *pvVar2 + '\x01';
    }
  }
  return;
}

Assistant:

static void shorten_number(std::string& unit_string, size_t loc, size_t length)
{
    auto c = unit_string[loc];
    if (c == '.') {
        c = unit_string[loc + 1];
    }
    unit_string.erase(loc, length);
    if (c == '9') {
        if (unit_string[loc - 1] != '9') {
            ++unit_string[loc - 1];
        } else {
            int kk = 1;
            while (unit_string[loc - kk] == '9') {
                unit_string[loc - kk] = '0';
                if (loc - kk == 0) {
                    break;
                }
                ++kk;
            }
            if (loc - kk == 0 && unit_string[0] == '0') {
                unit_string.insert(unit_string.begin(), '1');
            } else {
                if (isDigitCharacter(unit_string[loc - kk])) {
                    ++unit_string[loc - kk];
                } else {
                    unit_string.insert(loc - kk + 1, 1, '1');
                }
            }
        }
    }
}